

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.H
# Opt level: O2

bool __thiscall
amrex::FArrayBox::contains_nan<(amrex::RunOn)1>
          (FArrayBox *this,Box *bx,int scomp,int ncomp,IntVect *where)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  double *pdVar17;
  
  iVar1 = (this->super_BaseFab<double>).domain.smallend.vect[0];
  iVar2 = (this->super_BaseFab<double>).domain.smallend.vect[1];
  iVar3 = (this->super_BaseFab<double>).domain.smallend.vect[2];
  lVar11 = (long)(((this->super_BaseFab<double>).domain.bigend.vect[2] - iVar3) + 1);
  lVar14 = (long)(bx->smallend).vect[2];
  lVar4 = (long)scomp;
  lVar5 = (long)(((this->super_BaseFab<double>).domain.bigend.vect[0] - iVar1) + 1);
  lVar13 = (long)(((this->super_BaseFab<double>).domain.bigend.vect[1] - iVar2) + 1);
  lVar6 = (long)(bx->smallend).vect[1];
  lVar12 = (long)(bx->smallend).vect[0];
  pdVar17 = (double *)
            (((lVar14 * 8 + lVar4 * lVar11 * 8 + (long)iVar3 * -8) * lVar13 + lVar6 * 8 +
             (long)iVar2 * -8) * lVar5 + lVar12 * 8 + (long)iVar1 * -8 +
            (long)(this->super_BaseFab<double>).dptr);
  lVar13 = lVar13 * lVar5;
  do {
    pdVar10 = pdVar17;
    lVar15 = lVar14;
    if (ncomp + scomp <= lVar4) {
LAB_00245acd:
      return lVar4 < ncomp + scomp;
    }
    for (; lVar7 = lVar6, pdVar9 = pdVar10, lVar15 <= (bx->bigend).vect[2]; lVar15 = lVar15 + 1) {
      for (; pdVar8 = pdVar9, lVar16 = lVar12, lVar7 <= (bx->bigend).vect[1]; lVar7 = lVar7 + 1) {
        for (; lVar16 <= (bx->bigend).vect[0]; lVar16 = lVar16 + 1) {
          if (NAN(*pdVar8)) {
            where->vect[0] = (int)lVar16;
            where->vect[1] = (int)lVar7;
            where->vect[2] = (int)lVar15;
            goto LAB_00245acd;
          }
          pdVar8 = pdVar8 + 1;
        }
        pdVar9 = pdVar9 + lVar5;
      }
      pdVar10 = pdVar10 + lVar13;
    }
    lVar4 = lVar4 + 1;
    pdVar17 = pdVar17 + lVar11 * lVar13;
  } while( true );
}

Assistant:

bool
FArrayBox::contains_nan (const Box& bx, int scomp, int ncomp, IntVect& where) const noexcept
{
    BL_ASSERT(scomp >= 0);
    BL_ASSERT(ncomp >= 1);
    BL_ASSERT(scomp <  nComp());
    BL_ASSERT(ncomp <= nComp());
    BL_ASSERT(domain.contains(bx));

    const auto& a = this->array();
#ifdef AMREX_USE_GPU
    if (run_on == RunOn::Device && Gpu::inLaunchRegion()) {
        Array<int,1+AMREX_SPACEDIM> ha{0,AMREX_D_DECL(std::numeric_limits<int>::lowest(),
                                                      std::numeric_limits<int>::lowest(),
                                                      std::numeric_limits<int>::lowest())};
        Gpu::DeviceVector<int> dv(1+AMREX_SPACEDIM);
        int* p = dv.data();
        Gpu::htod_memcpy_async(p, ha.data(), sizeof(int)*ha.size());
        amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            int* flag = p;
            bool t = false;
            for (int n = scomp; n < scomp+ncomp; ++n) {
                t = t || amrex::isnan(a(i,j,k,n));
            }
            if (t && (*flag == 0)) {
                if (Gpu::Atomic::Exch(flag,1) == 0) {
                    AMREX_D_TERM(p[1] = i;,
                                 p[2] = j;,
                                 p[3] = k;);
                }
            }
        });
        Gpu::dtoh_memcpy_async(ha.data(), p, sizeof(int)*ha.size());
        Gpu::streamSynchronize();
        where = IntVect(AMREX_D_DECL(ha[1],ha[2],ha[3]));
        return ha[0];
    } else
#endif
    {
        const auto lo = amrex::lbound(bx);
        const auto hi = amrex::ubound(bx);
        for (int n = scomp; n < scomp+ncomp; ++n) {
            for         (int k = lo.z; k <= hi.z; ++k) {
                for     (int j = lo.y; j <= hi.y; ++j) {
                    for (int i = lo.x; i <= hi.x; ++i) {
                        if (amrex::isnan(a(i,j,k,n))) {
                            where = IntVect(AMREX_D_DECL(i,j,k));
                            return true;
                        }
                    }
                }
            }
        }
        return false;
    }
}